

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O0

TValue * gc_step_jit_cp(lua_State *L,lua_CFunction dummy,void *ud)

{
  int iVar1;
  lua_State *in_RDX;
  long in_RDI;
  bool bVar2;
  MSize steps;
  int local_1c;
  
  *(undefined4 *)(*(long *)(in_RDI + 0x30) + 0x14) = 0;
  *(undefined4 *)(*(long *)(in_RDI + 0x30) + 0x10) = 0xfff00240;
  local_1c = (int)in_RDX;
  do {
    bVar2 = false;
    if (local_1c != 0) {
      iVar1 = lj_gc_step(in_RDX);
      bVar2 = iVar1 == 0;
    }
    local_1c = local_1c + -1;
  } while (bVar2);
  return (TValue *)0x0;
}

Assistant:

static TValue *gc_step_jit_cp(lua_State *L, lua_CFunction dummy, void *ud)
{
  MSize steps = (MSize)(uintptr_t)ud;
  UNUSED(dummy);

  /* Always catch error here and don't call error function. */
  cframe_errfunc(L->cframe) = 0;
  cframe_nres(L->cframe) = -2*LUAI_MAXSTACK*(int)sizeof(TValue);

  while (steps-- > 0 && lj_gc_step(L) == 0)
    ;

  return NULL;
}